

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O2

int mcpl2ssw(char *inmcplfile,char *outsswfile,char *refsswfile,long surface_id,
            long nparticles_limit)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ssw_file_t ff;
  char *pcVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  int64_t *hdrlen;
  uint np1;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int ssw_ssblen;
  undefined4 local_138;
  int local_134;
  long local_130;
  undefined8 local_128;
  char *hdrbuf;
  char *local_118;
  int64_t ssw_hdrlen;
  int local_108;
  int ssw_reclen;
  ulong local_100;
  int64_t ssw_nrsspos;
  int64_t ssw_np1pos;
  double ssb [11];
  mcpl_generic_wfilehandle_t fout;
  char ref_mcnpflavour_str [64];
  
  local_100 = nparticles_limit;
  uVar4 = mcpl_open_file();
  uVar5 = mcpl_hdr_srcname(uVar4);
  local_128 = uVar4;
  uVar4 = mcpl_hdr_nparticles(uVar4);
  printf("Opened MCPL file produced with \"%s\" (contains %llu particles)\n",uVar5,uVar4);
  if ((surface_id == 0) && (iVar2 = mcpl_hdr_has_userflags(local_128), iVar2 == 0)) {
    ssw_error(
             "MCPL file contains no userflags so parameter specifying resulting SSW surface ID of particles is mandatory (use -s<ID>)."
             );
  }
  puts("Opening reference SSW file:");
  ff = ssw_open_file(refsswfile);
  hdrlen = &ssw_hdrlen;
  ssw_layout(ff,&ssw_reclen,&ssw_ssblen,hdrlen,&ssw_np1pos,&ssw_nrsspos);
  local_134 = ssw_is_mcnp6(ff);
  if (local_134 == 0) {
    iVar2 = ssw_is_mcnpx(ff);
    local_138 = (undefined4)CONCAT71((int7)((ulong)hdrlen >> 8),1);
    if (iVar2 != 0) goto LAB_001041a6;
    ssw_is_mcnp5(ff);
  }
  local_138 = 0;
LAB_001041a6:
  ref_mcnpflavour_str[0] = '\0';
  pcVar6 = ssw_mcnpflavour(ff);
  ssw_strcat(ref_mcnpflavour_str,pcVar6,0x40);
  ssw_close_file(ff);
  mcpl_read_file_to_buffer(refsswfile,ssw_hdrlen,0,ssb,&hdrbuf);
  if ((hdrbuf == (char *)0x0) || (ssb[0] != (double)ssw_hdrlen)) {
    ssw_error("Problems extracting header from reference file");
  }
  local_108 = *(int *)(hdrbuf + ssw_np1pos);
  pcVar6 = hdrbuf + ssw_np1pos;
  pcVar6[0] = '\0';
  pcVar6[1] = '\0';
  pcVar6[2] = '\0';
  pcVar6[3] = '\0';
  pcVar6 = hdrbuf + ssw_nrsspos;
  pcVar6[0] = '\0';
  pcVar6[1] = '\0';
  pcVar6[2] = '\0';
  pcVar6[3] = '\0';
  puts("Creating (or overwriting) output SSW file.");
  mcpl_generic_wfopen(&fout,outsswfile);
  if (fout.internal == (void *)0x0) {
    ssw_error("Problems opening new SSW file");
  }
  mcpl_generic_fwrite(&fout,hdrbuf,ssw_hdrlen);
  free(hdrbuf);
  hdrbuf = (char *)0x0;
  if (ssw_ssblen - 0xcU < 0xfffffffe) {
    ssw_error("Unexpected length of ssb record in reference SSW file");
  }
  local_118 = outsswfile;
  if ((local_134 != 0) && (ssw_ssblen != 0xb)) {
    ssw_error("Unexpected length of ssb record in reference SSW file (expected 11 for MCNP6 files)")
    ;
  }
  ssb[0] = 0.0;
  puts("Initiating particle conversion loop.");
  local_130 = 0;
  uVar12 = 0;
LAB_001042db:
  do {
    pdVar7 = (double *)mcpl_read(local_128);
    lVar8 = local_130;
    if (pdVar7 == (double *)0x0) goto LAB_0010455e;
    ssb[0] = ssb[0] + 1.0;
    ssb[2] = pdVar7[0xb];
    ssb[3] = *pdVar7;
    ssb[4] = pdVar7[10] * 100000.0;
    ssb[5] = pdVar7[4];
    ssb[6] = pdVar7[5];
    ssb[7] = pdVar7[6];
    ssb[8] = pdVar7[7];
    ssb[9] = pdVar7[8];
    iVar2 = (int)surface_id;
    if (iVar2 == 0) {
      iVar2 = *(int *)((long)pdVar7 + 100);
    }
    if (iVar2 - 0xf4241U < 0xfff0bdc0) {
      pcVar6 = "Surface id must be in range 1..999999";
      if (iVar2 == 0) {
        pcVar6 = 
        "Could not determine surface ID: no global surface id specified and particle had no (or empty) userflags"
        ;
      }
      if (surface_id != 0) {
        pcVar6 = "Surface id must be in range 1..999999";
      }
      ssw_error(pcVar6);
    }
    iVar3 = *(int *)(pdVar7 + 0xc);
    if (local_134 == 0) {
      if ((char)local_138 != '\0') {
        iVar3 = conv_mcnpx_pdg2ssw(iVar3);
        goto LAB_001043d3;
      }
      uVar11 = 1;
      if (iVar3 != 0x840) {
        uVar11 = (ulong)((uint)(iVar3 == 0x16) * 2);
        goto LAB_001043d6;
      }
LAB_00104439:
      lVar8 = (uVar11 * 100000000 + (long)iVar2) * 8;
LAB_00104447:
      ssb[1] = (double)lVar8;
      if (ssw_ssblen == 0xb) {
        ssb[10] = 1.0;
      }
    }
    else {
      iVar3 = conv_mcnp6_pdg2ssw(iVar3);
LAB_001043d3:
      uVar11 = (ulong)iVar3;
LAB_001043d6:
      if (uVar11 == 0) {
        lVar8 = local_130 + 1;
        bVar1 = local_130 < 100;
        local_130 = lVar8;
        if ((bVar1) &&
           (printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to an %s particle type\n"
                   ,(long)*(int *)(pdVar7 + 0xc),ref_mcnpflavour_str), local_130 = lVar8,
           lVar8 == 100)) {
          puts("WARNING: Suppressing future warnings regarding non-convertible PDG codes.");
          local_130 = 100;
        }
        goto LAB_001042db;
      }
      if ((long)uVar11 < 1) {
        ssw_error("Logic error in PDG code conversions.");
      }
      if (local_134 == 0) {
        if ((char)local_138 == '\0') goto LAB_00104439;
        lVar8 = uVar11 * 1000000 + (long)iVar2;
        goto LAB_00104447;
      }
      ssb[10] = (double)iVar2;
      ssb[1] = (double)(long)(uVar11 << 2);
    }
    if (pdVar7[9] <= 0.0 && pdVar7[9] != 0.0) {
      ssb[1] = -ssb[1];
    }
    ssw_writerecord(&fout,ssw_reclen,(long)ssw_ssblen << 3,(char *)ssb);
    uVar12 = uVar12 + 1;
    if (local_100 == uVar12) {
      lVar9 = mcpl_hdr_nparticles(local_128);
      uVar12 = local_100;
      lVar8 = local_130;
      lVar9 = lVar9 - (local_130 + local_100);
      if (lVar9 != 0) {
        printf("Output limit of %li particles reached. Ignoring remaining %lli particles in the MCPL file.\n"
               ,local_100,lVar9);
      }
LAB_0010455e:
      pcVar6 = local_118;
      puts("Ending particle conversion loop.");
      if (lVar8 != 0) {
        printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes could not be converted to MCNP types.\n"
               ,lVar8);
      }
      iVar2 = (int)uVar12;
      uVar12 = uVar12 & 0xffffffff;
      if (iVar2 == 0) {
        uVar12 = 1;
        puts(
            "WARNING: Input MCPL file has 0 useful particles but we are setting number of histories in new SSW file to 1 to avoid creating an invalid file."
            );
      }
      uVar10 = (uint)uVar12;
      if ((int)uVar10 < 1) {
        uVar12 = (ulong)-uVar10;
      }
      np1 = -uVar10;
      if (-1 < local_108) {
        np1 = uVar10;
      }
      ssw_update_nparticles(&fout,ssw_np1pos,np1,ssw_nrsspos,iVar2);
      mcpl_close_file(local_128);
      mcpl_generic_fwclose(&fout);
      printf("Created %s with %lli particles (nrss) and %lli histories (np1).\n",pcVar6,(long)iVar2,
             uVar12);
      return 1;
    }
  } while( true );
}

Assistant:

int mcpl2ssw(const char * inmcplfile, const char * outsswfile, const char * refsswfile,
             long surface_id, long nparticles_limit)
{

  mcpl_file_t fmcpl = mcpl_open_file(inmcplfile);

  printf( "Opened MCPL file produced with \"%s\" (contains %llu particles)\n",
          mcpl_hdr_srcname(fmcpl),
          (unsigned long long)mcpl_hdr_nparticles(fmcpl) );

  if (surface_id==0 && !mcpl_hdr_has_userflags(fmcpl))
    ssw_error("MCPL file contains no userflags so parameter specifying "
              "resulting SSW surface ID of particles is mandatory (use -s<ID>).");

  printf("Opening reference SSW file:\n");
  ssw_file_t fsswref = ssw_open_file(refsswfile);

  //Open reference file and figure out variables like header length, position of
  //"nparticles"-like variables, fortran record length and mcnp version.
  int ssw_reclen;
  int ssw_ssblen;
  int64_t ssw_hdrlen;
  int64_t ssw_np1pos;
  int64_t ssw_nrsspos;
  ssw_layout(fsswref, &ssw_reclen, &ssw_ssblen, &ssw_hdrlen, &ssw_np1pos, &ssw_nrsspos);
  assert(ssw_np1pos<ssw_hdrlen);
  assert(ssw_nrsspos<ssw_hdrlen);

#define SSW_MCNP6 1
#define SSW_MCNPX 2
#define SSW_MCNP5 3
  int ssw_mcnp_type = 0;
  if (ssw_is_mcnp6(fsswref)) {
    ssw_mcnp_type = SSW_MCNP6;
  } else if (ssw_is_mcnpx(fsswref)) {
    ssw_mcnp_type = SSW_MCNPX;
  } else if (ssw_is_mcnp5(fsswref)) {
    ssw_mcnp_type = SSW_MCNP5;
  }
  assert(ssw_mcnp_type>0);
  char ref_mcnpflavour_str[64];
  ref_mcnpflavour_str[0] = '\0';
  ssw_strcat( ref_mcnpflavour_str,
              ssw_mcnpflavour(fsswref),
              sizeof(ref_mcnpflavour_str) );
  ssw_close_file(fsswref);

  //Grab the header:
  char * hdrbuf;
  {
    uint64_t actual_size;
    mcpl_read_file_to_buffer( refsswfile,
                              (uint64_t)ssw_hdrlen,
                              0,//not text
                              &actual_size,
                              &hdrbuf );
    if ( !hdrbuf || actual_size != (uint64_t)ssw_hdrlen )
      ssw_error("Problems extracting header from reference file");
  }

  int32_t orig_np1 = * ((int32_t*)(&hdrbuf[ssw_np1pos]));

  //Clear |np1| and nrss in header to to indicate incomplete info (we will
  //update just before closing the file):
  *((int32_t*)(&hdrbuf[ssw_np1pos])) = 0;
  *((int32_t*)(&hdrbuf[ssw_nrsspos])) = 0;

  printf("Creating (or overwriting) output SSW file.\n");

  //Open new ssw file:
  mcpl_generic_wfilehandle_t fout = mcpl_generic_wfopen( outsswfile );
  if (!fout.internal)
    ssw_error("Problems opening new SSW file");

  //Write header:
  mcpl_generic_fwrite( &fout, hdrbuf, ssw_hdrlen);
  free(hdrbuf);
  hdrbuf = NULL;

  double ssb[11];

  if ( ssw_ssblen != 10 && ssw_ssblen != 11)
    ssw_error("Unexpected length of ssb record in reference SSW file");
  if ( (ssw_mcnp_type == SSW_MCNP6) && ssw_ssblen != 11 )
    ssw_error("Unexpected length of ssb record in reference SSW file (expected 11 for MCNP6 files)");

  //ssb[0] should be history number (starting from 1), but in our case we always
  //put nhistories=nparticles, so it is simply incrementing by 1 for each particle.
  ssb[0] = 0.0;


  assert(surface_id>=0&&surface_id<1000000);


  long used = 0;
  long long skipped_nosswtype = 0;

  printf("Initiating particle conversion loop.\n");

  while ( 1 ) {
    const mcpl_particle_t* mcpl_p = mcpl_read(fmcpl);
    if (!mcpl_p)
      break;
    ++ssb[0];
    ssb[2] = mcpl_p->weight;
    ssb[3] = mcpl_p->ekin;//already in MeV
    ssb[4] = mcpl_p->time * 1.0e5;//milliseconds to "shakes"
    ssb[5] = mcpl_p->position[0];//already in cm
    ssb[6] = mcpl_p->position[1];//already in cm
    ssb[7] = mcpl_p->position[2];//already in cm
    ssb[8] = mcpl_p->direction[0];
    ssb[9] = mcpl_p->direction[1];

    int32_t isurf = surface_id;
    if (!isurf)
      isurf = (int32_t)mcpl_p->userflags;

    if (isurf<=0||isurf>1000000) {
      if (isurf==0&&surface_id==0)
        ssw_error("Could not determine surface ID: no global surface id specified and particle had no (or empty) userflags");
      else
        ssw_error("Surface id must be in range 1..999999");
    }

    int64_t rawtype;
    if (ssw_mcnp_type == SSW_MCNP6) {
      rawtype = conv_mcnp6_pdg2ssw(mcpl_p->pdgcode);
    } else if (ssw_mcnp_type == SSW_MCNPX) {
      rawtype = conv_mcnpx_pdg2ssw(mcpl_p->pdgcode);
    } else {
      assert(ssw_mcnp_type == SSW_MCNP5);
      rawtype = (mcpl_p->pdgcode==2112?1:(mcpl_p->pdgcode==22?2:0));
    }

    if (!rawtype) {
      ++skipped_nosswtype;
      if (skipped_nosswtype<=100) {
        printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to an %s particle type\n",
               (long)mcpl_p->pdgcode,ref_mcnpflavour_str);
        if (skipped_nosswtype==100)
          printf("WARNING: Suppressing future warnings regarding non-convertible PDG codes.\n");
      }
      continue;
    }

    if ( !(rawtype>0 ) )
      ssw_error("Logic error in PDG code conversions.");
    assert(rawtype>0);

    if (ssw_mcnp_type == SSW_MCNP6) {
      assert(ssw_ssblen==11);
      ssb[10] = isurf;//Should we set the sign of ssb[10] to mean something (we take abs(ssb[10]) in sswread.c)?
      ssb[1] = (double)(((int64_t)rawtype)*4);//Shift 2 bits (thus we only create files with those two bits zero!)
    } else if (ssw_mcnp_type == SSW_MCNPX) {
      ssb[1] = (double)(isurf + 1000000*((int64_t)rawtype));
      if (ssw_ssblen==11)
        ssb[10] = 1.0;//Cosine of angle at surface? Can't calculate it, so we simply set
                      //it to 1 (seems to be not used anyway?)
    } else {
      assert(ssw_mcnp_type == SSW_MCNP5);
      //NOTE: We had for MCPL <=1.6.x: ssb[1] = (isurf + 1000000*rawtype)*8; But
      //now we try instead:
      ssb[1] = (double)((isurf + 100000000*((int64_t)rawtype))*8);
      if (ssw_ssblen==11)
        ssb[10] = 1.0;//Cosine of angle at surface? Can't calculate it, so we simply set
                      //it to 1 (seems to be not used anyway?)
    }

    //Sign of ssb[1] is used to store the sign of dirz:
    assert(ssb[1] >= 1.0);
    if (mcpl_p->direction[2]<0.0)
      ssb[1] = - ssb[1];

    ssw_writerecord(&fout,ssw_reclen,sizeof(double)*ssw_ssblen,(char*)&ssb[0]);
    if (++used==nparticles_limit) {
      long long remaining = mcpl_hdr_nparticles(fmcpl) - skipped_nosswtype - used;
      if (remaining)
        printf("Output limit of %li particles reached. Ignoring remaining %lli particles in the MCPL file.\n",
               nparticles_limit,remaining);
      break;
    }
  }

  printf("Ending particle conversion loop.\n");

  if (skipped_nosswtype) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes"
           " could not be converted to MCNP types.\n",(long long)skipped_nosswtype);
  }

  int32_t new_nrss = used;
  int32_t new_np1 = new_nrss;

  if (new_np1==0) {
    //SSW files must at least have 1 history (but can have 0 particles)
    printf("WARNING: Input MCPL file has 0 useful particles but we are setting number"
           " of histories in new SSW file to 1 to avoid creating an invalid file.\n");
    new_np1 = 1;
  }
  if (orig_np1<0)
    new_np1 = - new_np1;

  ssw_update_nparticles(&fout,ssw_np1pos,new_np1,ssw_nrsspos,new_nrss);

  mcpl_close_file(fmcpl);
  mcpl_generic_fwclose(&fout);

  printf("Created %s with %lli particles (nrss) and %lli histories (np1).\n",outsswfile,(long long)new_nrss,(long long)labs(new_np1));
  return 1;


}